

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

int traverseephemeron(global_State *g,Table *h,int inv)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  GCObject *pGVar6;
  long lVar7;
  Node *pNVar8;
  int local_40;
  
  uVar3 = luaH_realasize(h);
  lVar7 = 1L << (h->lsizenode & 0x3f);
  bVar2 = false;
  local_40 = 0;
  if (uVar3 != 0) {
    lVar5 = 0;
    local_40 = 0;
    do {
      if ((((&h->array->tt_)[lVar5] & 0x40) != 0) &&
         (pGVar6 = *(GCObject **)((long)&h->array->value_ + lVar5), (pGVar6->marked & 0x18) != 0)) {
        reallymarkobject(g,pGVar6);
        local_40 = 1;
      }
      lVar5 = lVar5 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar5);
  }
  lVar5 = 0;
  bVar1 = false;
  do {
    if (inv == 0) {
      pNVar8 = (Node *)((long)h->node + lVar5);
    }
    else {
      pNVar8 = h->node + ((int)lVar7 - 1);
    }
    if (((pNVar8->u).tt_ & 0xf) == 0) {
      if (((pNVar8->u).key_tt & 0x40) != 0) {
        (pNVar8->u).key_tt = '\v';
      }
    }
    else {
      if (((pNVar8->u).key_tt & 0x40) == 0) {
        pGVar6 = (GCObject *)0x0;
      }
      else {
        pGVar6 = (pNVar8->u).key_val.gc;
      }
      iVar4 = iscleared(g,pGVar6);
      if (iVar4 == 0) {
        if ((((pNVar8->u).tt_ & 0x40) != 0) && (((*(GCObject **)pNVar8)->marked & 0x18) != 0)) {
          reallymarkobject(g,*(GCObject **)pNVar8);
          local_40 = 1;
        }
      }
      else {
        bVar2 = true;
        if ((((pNVar8->u).tt_ & 0x40) != 0) &&
           (bVar2 = true, (((pNVar8->u).value_.gc)->marked & 0x18) != 0)) {
          bVar1 = true;
        }
      }
    }
    lVar5 = lVar5 + 0x18;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  if (g->gcstate == '\0') {
    h->gclist = g->grayagain;
    g->grayagain = (GCObject *)h;
  }
  else if (bVar1) {
    h->gclist = g->ephemeron;
    g->ephemeron = (GCObject *)h;
  }
  else {
    if (!bVar2) {
      genlink(g,(GCObject *)h);
      return local_40;
    }
    h->gclist = g->allweak;
    g->allweak = (GCObject *)h;
  }
  h->marked = h->marked & 199;
  return local_40;
}

Assistant:

static int traverseephemeron (global_State *g, Table *h, int inv) {
  int marked = 0;  /* true if an object is marked in this traversal */
  int hasclears = 0;  /* true if table has white keys */
  int hasww = 0;  /* true if table has entry "white-key -> white-value" */
  unsigned int i;
  unsigned int asize = luaH_realasize(h);
  unsigned int nsize = sizenode(h);
  /* traverse array part */
  for (i = 0; i < asize; i++) {
    if (valiswhite(&h->array[i])) {
      marked = 1;
      reallymarkobject(g, gcvalue(&h->array[i]));
    }
  }
  /* traverse hash part; if 'inv', traverse descending
     (see 'convergeephemerons') */
  for (i = 0; i < nsize; i++) {
    Node *n = inv ? gnode(h, nsize - 1 - i) : gnode(h, i);
    if (isempty(gval(n)))  /* entry is empty? */
      clearkey(n);  /* clear its key */
    else if (iscleared(g, gckeyN(n))) {  /* key is not marked (yet)? */
      hasclears = 1;  /* table must be cleared */
      if (valiswhite(gval(n)))  /* value not marked yet? */
        hasww = 1;  /* white-white entry */
    }
    else if (valiswhite(gval(n))) {  /* value not marked yet? */
      marked = 1;
      reallymarkobject(g, gcvalue(gval(n)));  /* mark it now */
    }
  }
  /* link table into proper list */
  if (g->gcstate == GCSpropagate)
    linkgclist(h, g->grayagain);  /* must retraverse it in atomic phase */
  else if (hasww)  /* table has white->white entries? */
    linkgclist(h, g->ephemeron);  /* have to propagate again */
  else if (hasclears)  /* table has white keys? */
    linkgclist(h, g->allweak);  /* may have to clean white keys */
  else
    genlink(g, obj2gco(h));  /* check whether collector still needs to see it */
  return marked;
}